

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompression.cpp
# Opt level: O1

void testCompression(string *tempDir)

{
  int iVar1;
  ushort *puVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  double __x;
  double __x_00;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined3 uVar9;
  char cVar10;
  ushort uVar11;
  uint16_t uVar12;
  undefined2 uVar13;
  byte bVar14;
  int y;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int w;
  long lVar19;
  int y_3;
  int x_3;
  int y_1;
  int x;
  long lVar20;
  half *phVar21;
  long lVar22;
  float *pfVar23;
  int x_1;
  int y_2;
  ulong uVar24;
  int x_2;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  pixelArray array;
  undefined8 uStack_e0;
  pixelArray local_d8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing pixel data types, subsampling and compression schemes",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  anon_unknown.dwarf_afcf6::pixelArray::pixelArray(&local_d8,0x9f,0x55b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"only zeroes",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar17 = 0;
  do {
    lVar19 = lVar17 * local_d8.i._sizeY;
    lVar20 = 0;
    do {
      (local_d8.i._data + lVar19)[lVar20] = 0;
      local_d8.h._data[lVar17 * local_d8.h._sizeY + lVar20]._h = 0;
      local_d8.f._data[lVar17 * local_d8.f._sizeY + lVar20] = 0.0;
      lVar22 = 0x58;
      do {
        *(undefined2 *)
         (*(long *)((long)&uStack_e0 + lVar22) * lVar17 * 2 +
          *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar22) + lVar20 * 2)
             = 0;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0xb8);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x55b);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x9f);
  anon_unknown.dwarf_afcf6::writeRead
            (tempDir,&local_d8,(int)(local_d8.i._data + lVar19),0x9f,0x55b,0xb8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 1",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar17 = 0;
  do {
    phVar21 = local_d8.h._data + lVar17 * local_d8.h._sizeY;
    pfVar23 = local_d8.f._data + lVar17 * local_d8.f._sizeY;
    lVar19 = 0;
    do {
      uVar15 = (int)lVar19 + (int)lVar17 & 1;
      fVar28 = (float)uVar15;
      local_d8.i._data[lVar17 * local_d8.i._sizeY + lVar19] = uVar15;
      if ((uint)fVar28 < 0x38800000) {
        if ((uint)fVar28 < 0x33000001) {
          uVar11 = 0;
        }
        else {
          uVar15 = (uint)fVar28 & 0x7fffff | 0x800000;
          cVar10 = (char)((uint)fVar28 >> 0x17);
          uVar11 = (ushort)(uVar15 >> (0x7eU - cVar10 & 0x1f));
          if (0x80000000 < uVar15 << (cVar10 + 0xa2U & 0x1f)) {
            uVar11 = uVar11 + 1;
          }
        }
      }
      else if ((uint)fVar28 < 0x7f800000) {
        if ((uint)fVar28 < 0x477ff000) {
          uVar11 = (ushort)((int)fVar28 + 0x8000fff + (uint)(((uint)fVar28 >> 0xd & 1) != 0) >> 0xd)
          ;
        }
        else {
          uVar11 = 0x7c00;
        }
      }
      else {
        uVar11 = 0x7c00;
        if (fVar28 != INFINITY) {
          uVar15 = (uint)fVar28 >> 0xd & 0x3ff;
          uVar11 = (ushort)(uVar15 == 0) | (ushort)uVar15 | 0x7c00;
        }
      }
      uVar15 = (uint)fVar28 & 0x7fffff | 0x800000;
      cVar10 = (char)((uint)fVar28 >> 0x17);
      uVar25 = (uint)fVar28 >> 0xd & 0x3ff;
      uVar16 = (uint)(0x80000000 < uVar15 << (cVar10 + 0xa2U & 0x1f)) +
               (uVar15 >> (0x7eU - cVar10 & 0x1f));
      uVar15 = (int)fVar28 + 0x8000fff + (uint)(((uint)fVar28 >> 0xd & 1) != 0) >> 0xd;
      if (0x477fefff < (uint)fVar28) {
        uVar15 = 0x7c00;
      }
      uVar25 = uVar25 | 0x7c00 | (uint)(uVar25 == 0);
      if (fVar28 == INFINITY) {
        uVar25 = 0x7c00;
      }
      if ((uint)fVar28 < 0x7f800000) {
        uVar25 = uVar15;
      }
      if ((uint)fVar28 < 0x33000001) {
        uVar16 = 0;
      }
      phVar21[lVar19]._h = uVar11;
      pfVar23[lVar19] = fVar28;
      if (0x387fffff < (uint)fVar28) {
        uVar16 = uVar25;
      }
      lVar20 = 0x58;
      do {
        *(short *)(*(long *)((long)&uStack_e0 + lVar20) * lVar17 * 2 +
                   *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar20) +
                  lVar19 * 2) = (short)uVar16;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0xb8);
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0x55b);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x9f);
  anon_unknown.dwarf_afcf6::writeRead(tempDir,&local_d8,0x7c00,uVar16,(int)phVar21,(int)pfVar23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pattern 2",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  uVar24 = 0;
  do {
    __x = (double)(int)uVar24;
    __x_00 = __x * 0.5;
    uVar26 = 0;
    do {
      uVar27 = uVar26 & 0xffffffff;
      uVar15 = (int)uVar26 + (int)((uVar26 & 0xffffffff) / 100) * -100 +
               ((int)uVar24 + (int)((uVar24 & 0xffffffff) / 100) * -100) * 100;
      uVar18 = (ulong)uVar15;
      local_d8.i._data[uVar24 * local_d8.i._sizeY + uVar26] = uVar15;
      dVar6 = (double)(int)uVar26;
      dVar7 = sin(dVar6);
      dVar8 = sin(__x_00);
      fVar28 = ABS((float)(dVar8 + dVar7));
      uVar11 = (ushort)((uint)(float)(dVar8 + dVar7) >> 0x10) & 0x8000;
      if ((uint)fVar28 < 0x38800000) {
        if (0x33000000 < (uint)fVar28) {
          uVar15 = (uint)fVar28 & 0x7fffff | 0x800000;
          iVar1 = ((uint)fVar28 >> 0x17) - 0x5e;
          uVar9 = (undefined3)((uint)iVar1 >> 8);
          bVar14 = 0x7e - (char)((uint)fVar28 >> 0x17);
          uVar18 = (ulong)CONCAT31(uVar9,bVar14);
          uVar11 = uVar11 | (ushort)(uVar15 >> (bVar14 & 0x1f));
          if (uVar15 << ((byte)iVar1 & 0x1f) < 0x80000001) {
            uVar18 = (ulong)CONCAT31(uVar9,1);
          }
          else {
            uVar11 = uVar11 + 1;
          }
        }
      }
      else if ((uint)fVar28 < 0x7f800000) {
        if ((uint)fVar28 < 0x477ff000) {
          uVar11 = (ushort)((int)fVar28 + 0x8000fff + (uint)(((uint)fVar28 >> 0xd & 1) != 0) >> 0xd)
                   | uVar11;
        }
        else {
          uVar11 = uVar11 | 0x7c00;
        }
      }
      else {
        uVar11 = uVar11 | 0x7c00;
        if (fVar28 != INFINITY) {
          uVar15 = (uint)fVar28 >> 0xd & 0x3ff;
          uVar18 = (ulong)(uVar15 == 0);
          uVar11 = uVar11 | (ushort)uVar15 | (ushort)(uVar15 == 0);
        }
      }
      local_d8.h._data[uVar24 * local_d8.h._sizeY + uVar26]._h = uVar11;
      dVar7 = sin(__x);
      dVar6 = sin(dVar6 * 0.5);
      local_d8.f._data[uVar24 * local_d8.f._sizeY + uVar26] = (float)(dVar6 + dVar7);
      lVar17 = 0x58;
      do {
        dVar6 = sin((double)(int)uVar27);
        dVar7 = sin(__x_00);
        fVar28 = ABS((float)(dVar7 + dVar6));
        uVar15 = (uint)(float)(dVar7 + dVar6) >> 0x10 & 0x8000;
        if ((uint)fVar28 < 0x38800000) {
          if (0x33000000 < (uint)fVar28) {
            uVar25 = (uint)fVar28 >> 0x17;
            phVar21 = (half *)(ulong)uVar25;
            uVar16 = (uint)fVar28 & 0x7fffff | 0x800000;
            uVar9 = (undefined3)(uVar25 - 0x5e >> 8);
            bVar14 = 0x7e - (char)uVar25;
            uVar18 = (ulong)CONCAT31(uVar9,bVar14);
            uVar15 = uVar15 | uVar16 >> (bVar14 & 0x1f);
            if (uVar16 << ((byte)(uVar25 - 0x5e) & 0x1f) < 0x80000001) {
              uVar18 = (ulong)CONCAT31(uVar9,1);
            }
            else {
              uVar15 = uVar15 + 1;
            }
          }
        }
        else if ((uint)fVar28 < 0x7f800000) {
          if ((uint)fVar28 < 0x477ff000) {
            uVar15 = (int)fVar28 + 0x8000fff + (uint)(((uint)fVar28 >> 0xd & 1) != 0) >> 0xd |
                     uVar15;
          }
          else {
            uVar15 = uVar15 | 0x7c00;
          }
        }
        else {
          uVar15 = uVar15 | 0x7c00;
          if (fVar28 != INFINITY) {
            uVar16 = (uint)fVar28 >> 0xd & 0x3ff;
            uVar18 = (ulong)(uVar16 == 0);
            uVar15 = uVar15 | uVar16 | (uint)(uVar16 == 0);
          }
        }
        *(short *)(*(long *)((long)&uStack_e0 + lVar17) * uVar24 * 2 +
                   *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar17) +
                  uVar26 * 2) = (short)uVar15;
        lVar17 = lVar17 + 0x18;
        uVar27 = (ulong)((int)uVar27 + 1);
      } while (lVar17 != 0xb8);
      uVar26 = uVar26 + 1;
    } while (uVar26 != 0x55b);
    uVar24 = uVar24 + 1;
  } while (uVar24 != 0x9f);
  anon_unknown.dwarf_afcf6::writeRead
            (tempDir,&local_d8,uVar15,(int)uVar18,(int)phVar21,(int)pfVar23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"random bits",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  puVar2 = (ushort *)((long)&uStack_e0 + 2);
  uStack_e0._2_4_ = 0x5a5a5a5a;
  uStack_e0._6_2_ = 0x5a5a;
  lVar17 = 0;
  do {
    lVar19 = lVar17 * local_d8.f._sizeY;
    lVar20 = 0;
    do {
      uVar15 = Imath_3_2::nrand48(puVar2);
      local_d8.i._data[lVar17 * local_d8.i._sizeY + lVar20] = uVar15;
      uVar12 = Imath_3_2::nrand48(puVar2);
      local_d8.h._data[lVar17 * local_d8.h._sizeY + lVar20]._h = uVar12;
      lVar22 = 0x58;
      do {
        lVar3 = *(long *)((long)&uStack_e0 + lVar22);
        lVar4 = *(long *)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar22);
        uVar13 = Imath_3_2::nrand48(puVar2);
        *(undefined2 *)(lVar4 + lVar3 * lVar17 * 2 + lVar20 * 2) = uVar13;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0xb8);
      fVar28 = (float)Imath_3_2::nrand48(puVar2);
      (local_d8.f._data + lVar19)[lVar20] = fVar28;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x55b);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x9f);
  anon_unknown.dwarf_afcf6::writeRead
            (tempDir,&local_d8,w,(int)(local_d8.f._data + lVar19),(int)phVar21,(int)pfVar23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  lVar17 = 0xa0;
  do {
    pvVar5 = *(void **)((long)&(((pixelArray *)(local_d8.rgba + -3))->i)._sizeX + lVar17);
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != 0x40);
  if (local_d8.h._data != (half *)0x0) {
    operator_delete__(local_d8.h._data);
  }
  if (local_d8.f._data != (float *)0x0) {
    operator_delete__(local_d8.f._data);
  }
  if (local_d8.i._data != (uint *)0x0) {
    operator_delete__(local_d8.i._data);
  }
  return;
}

Assistant:

void
testCompression (const std::string& tempDir)
{
    try
    {
        cout << "Testing pixel data types, "
                "subsampling and "
                "compression schemes"
             << endl;

        const int W  = 1371;
        const int H  = 159;
        const int DX = 17;
        const int DY = 29;

        pixelArray array (H, W);

        //
        // If the following assertion fails, new pixel types have
        // been added to the Imf library; testing code for the new
        // pixel types should be added to this file.
        //

        assert (NUM_PIXELTYPES == 3);

        fillPixels1 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels2 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels3 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        fillPixels4 (array, W, H);
        writeRead (tempDir, array, W, H, DX, DY);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}